

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

void increment(char *s)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = strlen(s);
  if (0 < (int)(uint)sVar1) {
    lVar2 = (ulong)((uint)sVar1 & 0x7fffffff) + 1;
    do {
      if (s[lVar2 + -2] != '9') {
        s[lVar2 + -2] = s[lVar2 + -2] + '\x01';
        return;
      }
      s[lVar2 + -2] = '0';
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void increment(char *s) {
  for (int i = static_cast<int>(std::strlen(s)) - 1; i >= 0; --i) {
    if (s[i] != '9') {
      ++s[i];
      break;
    }
    s[i] = '0';
  }
}